

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O2

void Llb4_Nonlin4SweepExperiment(Aig_Man_t *pAig)

{
  Vec_Ptr_t *vGroups;
  Vec_Int_t *vOrder;
  DdManager *dd;
  
  Llb4_Nonlin4Sweep(pAig,100,500,&dd,&vOrder,&vGroups,1);
  Llb_Nonlin4SweepDeref(dd,vGroups);
  Cudd_RecursiveDeref(dd,dd->bFunc);
  Extra_StopManager(dd);
  Vec_IntFree(vOrder);
  return;
}

Assistant:

void Llb4_Nonlin4SweepExperiment( Aig_Man_t * pAig )
{
    DdManager * dd;
    Vec_Int_t * vOrder;
    Vec_Ptr_t * vGroups;
    Llb4_Nonlin4Sweep( pAig, 100, 500, &dd, &vOrder, &vGroups, 1 );

    Llb_Nonlin4SweepDeref( dd, vGroups );

    Cudd_RecursiveDeref( dd, dd->bFunc );
    Extra_StopManager( dd );
    Vec_IntFree( vOrder );
}